

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render-data.hh
# Opt level: O1

void __thiscall
tinyusdz::tydra::AnimationChannel::AnimationChannel
          (AnimationChannel *this,AnimationChannel *param_1)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  
  this->type = param_1->type;
  (this->transforms).static_value.has_value_ = (param_1->transforms).static_value.has_value_;
  if ((param_1->transforms).static_value.has_value_ == true) {
    uVar1 = *(undefined8 *)&(param_1->transforms).static_value.contained;
    uVar2 = *(undefined8 *)((long)&(param_1->transforms).static_value.contained + 8);
    uVar3 = *(undefined8 *)((long)&(param_1->transforms).static_value.contained + 0x10);
    uVar4 = *(undefined8 *)((long)&(param_1->transforms).static_value.contained + 0x18);
    uVar5 = *(undefined8 *)((long)&(param_1->transforms).static_value.contained + 0x20);
    uVar6 = *(undefined8 *)((long)&(param_1->transforms).static_value.contained + 0x28);
    uVar7 = *(undefined8 *)((long)&(param_1->transforms).static_value.contained + 0x38);
    *(undefined8 *)((long)&(this->transforms).static_value.contained + 0x30) =
         *(undefined8 *)((long)&(param_1->transforms).static_value.contained + 0x30);
    *(undefined8 *)((long)&(this->transforms).static_value.contained + 0x38) = uVar7;
    *(undefined8 *)((long)&(this->transforms).static_value.contained + 0x20) = uVar5;
    *(undefined8 *)((long)&(this->transforms).static_value.contained + 0x28) = uVar6;
    *(undefined8 *)((long)&(this->transforms).static_value.contained + 0x10) = uVar3;
    *(undefined8 *)((long)&(this->transforms).static_value.contained + 0x18) = uVar4;
    *(undefined8 *)&(this->transforms).static_value.contained = uVar1;
    *(undefined8 *)((long)&(this->transforms).static_value.contained + 8) = uVar2;
  }
  ::std::
  vector<tinyusdz::tydra::AnimationSample<tinyusdz::value::matrix4f>,_std::allocator<tinyusdz::tydra::AnimationSample<tinyusdz::value::matrix4f>_>_>
  ::vector(&(this->transforms).samples,&(param_1->transforms).samples);
  (this->transforms).interpolation = (param_1->transforms).interpolation;
  (this->translations).static_value.has_value_ = (param_1->translations).static_value.has_value_;
  if ((param_1->translations).static_value.has_value_ == true) {
    *(undefined4 *)((long)&(this->translations).static_value.contained + 8) =
         *(undefined4 *)((long)&(param_1->translations).static_value.contained + 8);
    *(undefined8 *)&(this->translations).static_value.contained =
         *(undefined8 *)&(param_1->translations).static_value.contained;
  }
  ::std::
  vector<tinyusdz::tydra::AnimationSample<std::array<float,_3UL>_>,_std::allocator<tinyusdz::tydra::AnimationSample<std::array<float,_3UL>_>_>_>
  ::vector(&(this->translations).samples,&(param_1->translations).samples);
  (this->translations).interpolation = (param_1->translations).interpolation;
  (this->rotations).static_value.has_value_ = (param_1->rotations).static_value.has_value_;
  if ((param_1->rotations).static_value.has_value_ == true) {
    uVar1 = *(undefined8 *)((long)&(param_1->rotations).static_value.contained + 8);
    *(undefined8 *)&(this->rotations).static_value.contained =
         *(undefined8 *)&(param_1->rotations).static_value.contained;
    *(undefined8 *)((long)&(this->rotations).static_value.contained + 8) = uVar1;
  }
  ::std::
  vector<tinyusdz::tydra::AnimationSample<std::array<float,_4UL>_>,_std::allocator<tinyusdz::tydra::AnimationSample<std::array<float,_4UL>_>_>_>
  ::vector(&(this->rotations).samples,&(param_1->rotations).samples);
  (this->rotations).interpolation = (param_1->rotations).interpolation;
  (this->scales).static_value.has_value_ = (param_1->scales).static_value.has_value_;
  if ((param_1->scales).static_value.has_value_ == true) {
    *(undefined4 *)((long)&(this->scales).static_value.contained + 8) =
         *(undefined4 *)((long)&(param_1->scales).static_value.contained + 8);
    *(undefined8 *)&(this->scales).static_value.contained =
         *(undefined8 *)&(param_1->scales).static_value.contained;
  }
  ::std::
  vector<tinyusdz::tydra::AnimationSample<std::array<float,_3UL>_>,_std::allocator<tinyusdz::tydra::AnimationSample<std::array<float,_3UL>_>_>_>
  ::vector(&(this->scales).samples,&(param_1->scales).samples);
  (this->scales).interpolation = (param_1->scales).interpolation;
  (this->weights).static_value.has_value_ = (param_1->weights).static_value.has_value_;
  if ((param_1->weights).static_value.has_value_ == true) {
    (this->weights).static_value.contained = (param_1->weights).static_value.contained;
  }
  ::std::
  vector<tinyusdz::tydra::AnimationSample<float>,_std::allocator<tinyusdz::tydra::AnimationSample<float>_>_>
  ::vector(&(this->weights).samples,&(param_1->weights).samples);
  (this->weights).interpolation = (param_1->weights).interpolation;
  return;
}

Assistant:

AnimationChannel() = default;